

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O1

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  int iVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  void *pvVar49;
  float fVar50;
  float fVar51;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  undefined1 (*pauVar55) [32];
  float *pfVar56;
  undefined1 (*pauVar57) [32];
  uint uVar58;
  int iVar59;
  ulong uVar60;
  float *pfVar61;
  float *pfVar62;
  long lVar63;
  float *pfVar64;
  float fVar67;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  
  iVar45 = top_blob->c;
  if (0 < (long)iVar45) {
    uVar46 = bottom_blob->c;
    uVar47 = top_blob->w;
    iVar48 = top_blob->h;
    pvVar49 = _bias->data;
    lVar63 = 0;
    do {
      uVar60 = (long)top_blob->h * (long)top_blob->w;
      uVar54 = top_blob->elemsize;
      uVar53 = (uVar54 * uVar60 + 0xf & 0xfffffffffffffff0) / uVar54;
      if (top_blob->dims == 4) {
        uVar53 = uVar60;
      }
      if (pvVar49 == (void *)0x0) {
        auVar66 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar66 = *(undefined1 (*) [32])((long)pvVar49 + lVar63 * 0x20);
      }
      pauVar57 = (undefined1 (*) [32])(top_blob->cstep * lVar63 * uVar54 + (long)top_blob->data);
      iVar52 = (int)uVar53 * top_blob->d;
      pauVar55 = pauVar57;
      if (0 < iVar52) {
        do {
          *pauVar55 = auVar66;
          pauVar55 = pauVar55 + 1;
          iVar52 = iVar52 + -1;
        } while (iVar52 != 0);
      }
      if (0 < (int)uVar46) {
        uVar54 = 0;
        do {
          if (0 < iVar48) {
            pfVar64 = (float *)((long)kernel->data +
                               (long)kernel->w * uVar54 * kernel->elemsize +
                               kernel->cstep * lVar63 * kernel->elemsize);
            pfVar56 = (float *)(bottom_blob->cstep * uVar54 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar61 = (float *)((long)bottom_blob->w * bottom_blob->elemsize + (long)pfVar56);
            iVar52 = 0;
            pauVar55 = pauVar57;
            do {
              if ((int)uVar47 < 2) {
                uVar58 = 0;
              }
              else {
                iVar59 = 1;
                do {
                  fVar1 = *pfVar56;
                  fVar2 = pfVar56[1];
                  fVar3 = pfVar56[2];
                  fVar4 = pfVar56[3];
                  fVar5 = pfVar56[4];
                  fVar6 = pfVar56[5];
                  fVar7 = pfVar56[6];
                  fVar8 = pfVar56[7];
                  fVar50 = pfVar64[0x17];
                  fVar74 = fVar2 + fVar3 + fVar3;
                  fVar72 = fVar1 + *(float *)((long)*pauVar55 + 0x1c) + fVar3;
                  fVar9 = pfVar56[8];
                  fVar10 = pfVar56[9];
                  fVar11 = pfVar56[10];
                  fVar12 = pfVar56[0xb];
                  fVar13 = pfVar56[0xc];
                  fVar14 = pfVar56[0xd];
                  fVar67 = pfVar64[7] + *(float *)(pauVar55[1] + 0x1c);
                  fVar15 = pfVar56[0xe];
                  fVar16 = pfVar56[0xf];
                  fVar17 = pfVar56[0x10];
                  fVar18 = pfVar56[0x11];
                  fVar19 = pfVar56[0x12];
                  fVar20 = pfVar56[0x13];
                  fVar21 = pfVar56[0x14];
                  fVar22 = pfVar56[0x15];
                  fVar23 = pfVar56[0x16];
                  fVar24 = pfVar56[0x17];
                  fVar25 = *pfVar61;
                  fVar26 = pfVar61[1];
                  fVar75 = fVar20 + fVar18 + pfVar64[0xf] + fVar50 + fVar50 + fVar67 + pfVar64[0x3f]
                           + fVar16;
                  fVar27 = pfVar61[2];
                  fVar28 = pfVar61[3];
                  fVar29 = pfVar61[4];
                  fVar79 = pfVar64[0x67] + fVar74 + fVar3 + fVar72 + fVar9 + fVar12 + fVar14;
                  fVar30 = pfVar61[5];
                  fVar51 = pfVar64[0x8f];
                  fVar76 = fVar72 + fVar74 + pfVar64[0x37] + fVar11 + fVar13 + fVar15 + fVar75;
                  fVar72 = pfVar61[6];
                  fVar74 = pfVar61[7];
                  fVar69 = pfVar61[8];
                  fVar70 = pfVar61[9];
                  fVar71 = pfVar61[10];
                  fVar73 = fVar75 + fVar15 + fVar51;
                  fVar75 = pfVar61[0xb];
                  fVar31 = pfVar61[0xc];
                  fVar32 = pfVar61[0xd];
                  fVar33 = pfVar61[0xe];
                  fVar34 = pfVar61[0xf];
                  fVar77 = fVar79 + fVar25 + fVar76 + fVar79 + fVar74 + pfVar64[0xb7];
                  auVar66 = *(undefined1 (*) [32])(pfVar64 + 0xd8);
                  fVar78 = fVar72 + fVar29 + fVar76 + fVar27 + fVar51 + fVar71;
                  auVar41 = *(undefined1 (*) [32])(pfVar64 + 0xe0);
                  auVar42 = *(undefined1 (*) [32])(pfVar64 + 0xe8);
                  auVar43 = *(undefined1 (*) [32])(pfVar64 + 0xf0);
                  auVar44 = *(undefined1 (*) [32])(pfVar64 + 0xf8);
                  fVar76 = pfVar61[0x10];
                  fVar79 = pfVar61[0x11];
                  fVar35 = pfVar61[0x12];
                  fVar36 = pfVar61[0x13];
                  fVar37 = pfVar61[0x14];
                  fVar38 = pfVar61[0x15];
                  fVar39 = pfVar61[0x16];
                  fVar40 = pfVar61[0x17];
                  auVar68._0_4_ =
                       fVar72 * pfVar64[0xb0] +
                       pfVar64[0xa0] * fVar29 +
                       *pfVar64 * fVar1 + *(float *)*pauVar55 + pfVar64[0x20] * fVar5 +
                       fVar7 * pfVar64[0x30] + pfVar64[0x40] * fVar9 + pfVar64[0x50] * fVar11 +
                       pfVar64[0x60] * fVar13 + pfVar64[0x70] * fVar15 + fVar25 * pfVar64[0x80] +
                       pfVar64[0x90] * fVar27 + fVar69 * pfVar64[0xc0] + pfVar64[0xd0] * fVar71 +
                       fVar31 * auVar41._0_4_ + auVar43._0_4_ * fVar33 +
                       auVar44._0_4_ * fVar34 +
                       fVar32 * auVar42._0_4_ +
                       pfVar64[0x78] * fVar16 +
                       pfVar64[8] * fVar2 + pfVar64[0x10] * fVar3 + pfVar64[0x18] * fVar4 +
                       pfVar64[0x28] * fVar6 + fVar8 * pfVar64[0x38] + pfVar64[0x48] * fVar10 +
                       pfVar64[0x58] * fVar12 + pfVar64[0x68] * fVar14 + fVar26 * pfVar64[0x88] +
                       pfVar64[0x98] * fVar28 + pfVar64[0xa8] * fVar30 + pfVar64[0xb8] * fVar74 +
                       fVar70 * pfVar64[200] + auVar66._0_4_ * fVar75;
                  auVar68._4_4_ =
                       fVar72 * pfVar64[0xb1] +
                       pfVar64[0xa1] * fVar29 +
                       pfVar64[1] * fVar1 + *(float *)((long)*pauVar55 + 4) + pfVar64[0x21] * fVar5
                       + fVar7 * pfVar64[0x31] + pfVar64[0x41] * fVar9 + pfVar64[0x51] * fVar11 +
                       pfVar64[0x61] * fVar13 + pfVar64[0x71] * fVar15 + fVar25 * pfVar64[0x81] +
                       pfVar64[0x91] * fVar27 + fVar69 * pfVar64[0xc1] + pfVar64[0xd1] * fVar71 +
                       fVar31 * auVar41._4_4_ + auVar43._4_4_ * fVar33 +
                       auVar44._4_4_ * fVar34 +
                       fVar32 * auVar42._4_4_ +
                       pfVar64[0x79] * fVar16 +
                       pfVar64[9] * fVar2 + pfVar64[0x11] * fVar3 + pfVar64[0x19] * fVar4 +
                       pfVar64[0x29] * fVar6 + fVar8 * pfVar64[0x39] + pfVar64[0x49] * fVar10 +
                       pfVar64[0x59] * fVar12 + pfVar64[0x69] * fVar14 + fVar26 * pfVar64[0x89] +
                       pfVar64[0x99] * fVar28 + pfVar64[0xa9] * fVar30 + pfVar64[0xb9] * fVar74 +
                       fVar70 * pfVar64[0xc9] + auVar66._4_4_ * fVar75;
                  auVar68._8_4_ =
                       fVar72 * pfVar64[0xb2] +
                       pfVar64[0xa2] * fVar29 +
                       pfVar64[2] * fVar1 + *(float *)((long)*pauVar55 + 8) + pfVar64[0x22] * fVar5
                       + fVar7 * pfVar64[0x32] + pfVar64[0x42] * fVar9 + pfVar64[0x52] * fVar11 +
                       pfVar64[0x62] * fVar13 + pfVar64[0x72] * fVar15 + fVar25 * pfVar64[0x82] +
                       pfVar64[0x92] * fVar27 + fVar69 * pfVar64[0xc2] + pfVar64[0xd2] * fVar71 +
                       fVar31 * auVar41._8_4_ + auVar43._8_4_ * fVar33 +
                       auVar44._8_4_ * fVar34 +
                       fVar32 * auVar42._8_4_ +
                       pfVar64[0x7a] * fVar16 +
                       pfVar64[10] * fVar2 + pfVar64[0x12] * fVar3 + pfVar64[0x1a] * fVar4 +
                       pfVar64[0x2a] * fVar6 + fVar8 * pfVar64[0x3a] + pfVar64[0x4a] * fVar10 +
                       pfVar64[0x5a] * fVar12 + pfVar64[0x6a] * fVar14 + fVar26 * pfVar64[0x8a] +
                       pfVar64[0x9a] * fVar28 + pfVar64[0xaa] * fVar30 + pfVar64[0xba] * fVar74 +
                       fVar70 * pfVar64[0xca] + auVar66._8_4_ * fVar75;
                  auVar68._12_4_ =
                       fVar72 * pfVar64[0xb3] +
                       pfVar64[0xa3] * fVar29 +
                       pfVar64[3] * fVar1 + *(float *)((long)*pauVar55 + 0xc) +
                       pfVar64[0x23] * fVar5 + fVar7 * pfVar64[0x33] + pfVar64[0x43] * fVar9 +
                       pfVar64[0x53] * fVar11 + pfVar64[99] * fVar13 + pfVar64[0x73] * fVar15 +
                       fVar25 * pfVar64[0x83] + pfVar64[0x93] * fVar27 + fVar69 * pfVar64[0xc3] +
                       pfVar64[0xd3] * fVar71 + fVar31 * auVar41._12_4_ + auVar43._12_4_ * fVar33 +
                       auVar44._12_4_ * fVar34 +
                       fVar32 * auVar42._12_4_ +
                       pfVar64[0x7b] * fVar16 +
                       pfVar64[0xb] * fVar2 + pfVar64[0x13] * fVar3 + pfVar64[0x1b] * fVar4 +
                       pfVar64[0x2b] * fVar6 + fVar8 * pfVar64[0x3b] + pfVar64[0x4b] * fVar10 +
                       pfVar64[0x5b] * fVar12 + pfVar64[0x6b] * fVar14 + fVar26 * pfVar64[0x8b] +
                       pfVar64[0x9b] * fVar28 + pfVar64[0xab] * fVar30 + pfVar64[0xbb] * fVar74 +
                       fVar70 * pfVar64[0xcb] + auVar66._12_4_ * fVar75;
                  auVar68._16_4_ =
                       fVar72 * pfVar64[0xb4] +
                       pfVar64[0xa4] * fVar29 +
                       pfVar64[4] * fVar1 + *(float *)((long)*pauVar55 + 0x10) +
                       pfVar64[0x24] * fVar5 + fVar7 * pfVar64[0x34] + pfVar64[0x44] * fVar9 +
                       pfVar64[0x54] * fVar11 + pfVar64[100] * fVar13 + pfVar64[0x74] * fVar15 +
                       fVar25 * pfVar64[0x84] + pfVar64[0x94] * fVar27 + fVar69 * pfVar64[0xc4] +
                       pfVar64[0xd4] * fVar71 + fVar31 * auVar41._16_4_ + auVar43._16_4_ * fVar33 +
                       auVar44._16_4_ * fVar34 +
                       fVar32 * auVar42._16_4_ +
                       pfVar64[0x7c] * fVar16 +
                       pfVar64[0xc] * fVar2 + pfVar64[0x14] * fVar3 + pfVar64[0x1c] * fVar4 +
                       pfVar64[0x2c] * fVar6 + fVar8 * pfVar64[0x3c] + pfVar64[0x4c] * fVar10 +
                       pfVar64[0x5c] * fVar12 + pfVar64[0x6c] * fVar14 + fVar26 * pfVar64[0x8c] +
                       pfVar64[0x9c] * fVar28 + pfVar64[0xac] * fVar30 + pfVar64[0xbc] * fVar74 +
                       fVar70 * pfVar64[0xcc] + auVar66._16_4_ * fVar75;
                  auVar68._20_4_ =
                       fVar72 * pfVar64[0xb5] +
                       pfVar64[0xa5] * fVar29 +
                       pfVar64[5] * fVar1 + *(float *)((long)*pauVar55 + 0x14) +
                       pfVar64[0x25] * fVar5 + fVar7 * pfVar64[0x35] + pfVar64[0x45] * fVar9 +
                       pfVar64[0x55] * fVar11 + pfVar64[0x65] * fVar13 + pfVar64[0x75] * fVar15 +
                       fVar25 * pfVar64[0x85] + pfVar64[0x95] * fVar27 + fVar69 * pfVar64[0xc5] +
                       pfVar64[0xd5] * fVar71 + fVar31 * auVar41._20_4_ + auVar43._20_4_ * fVar33 +
                       auVar44._20_4_ * fVar34 +
                       fVar32 * auVar42._20_4_ +
                       pfVar64[0x7d] * fVar16 +
                       pfVar64[0xd] * fVar2 + pfVar64[0x15] * fVar3 + pfVar64[0x1d] * fVar4 +
                       pfVar64[0x2d] * fVar6 + fVar8 * pfVar64[0x3d] + pfVar64[0x4d] * fVar10 +
                       pfVar64[0x5d] * fVar12 + pfVar64[0x6d] * fVar14 + fVar26 * pfVar64[0x8d] +
                       pfVar64[0x9d] * fVar28 + pfVar64[0xad] * fVar30 + pfVar64[0xbd] * fVar74 +
                       fVar70 * pfVar64[0xcd] + auVar66._20_4_ * fVar75;
                  auVar68._24_4_ =
                       fVar72 * pfVar64[0xb6] +
                       pfVar64[0xa6] * fVar29 +
                       pfVar64[6] * fVar1 + *(float *)((long)*pauVar55 + 0x18) +
                       pfVar64[0x26] * fVar5 + fVar7 * pfVar64[0x36] + pfVar64[0x46] * fVar9 +
                       pfVar64[0x56] * fVar11 + pfVar64[0x66] * fVar13 + pfVar64[0x76] * fVar15 +
                       fVar25 * pfVar64[0x86] + pfVar64[0x96] * fVar27 + fVar69 * pfVar64[0xc6] +
                       pfVar64[0xd6] * fVar71 + fVar31 * auVar41._24_4_ + auVar43._24_4_ * fVar33 +
                       auVar44._24_4_ * fVar34 +
                       fVar32 * auVar42._24_4_ +
                       pfVar64[0x7e] * fVar16 +
                       pfVar64[0xe] * fVar2 + pfVar64[0x16] * fVar3 + pfVar64[0x1e] * fVar4 +
                       pfVar64[0x2e] * fVar6 + fVar8 * pfVar64[0x3e] + pfVar64[0x4e] * fVar10 +
                       pfVar64[0x5e] * fVar12 + pfVar64[0x6e] * fVar14 + fVar26 * pfVar64[0x8e] +
                       pfVar64[0x9e] * fVar28 + pfVar64[0xae] * fVar30 + pfVar64[0xbe] * fVar74 +
                       fVar70 * pfVar64[0xce] + auVar66._24_4_ * fVar75;
                  auVar68._28_4_ = fVar78 + fVar77 + fVar33 + fVar34 + fVar78 + fVar77 + fVar75;
                  auVar65._0_4_ =
                       fVar76 * pfVar64[0xc0] +
                       fVar21 * pfVar64[0x60] +
                       fVar9 * *pfVar64 + *(float *)pauVar55[1] + pfVar64[0x20] * fVar13 +
                       fVar15 * pfVar64[0x30] + fVar17 * pfVar64[0x40] + fVar19 * pfVar64[0x50] +
                       fVar23 * pfVar64[0x70] + fVar69 * pfVar64[0x80] + fVar71 * pfVar64[0x90] +
                       fVar31 * pfVar64[0xa0] + fVar33 * pfVar64[0xb0] + fVar35 * pfVar64[0xd0] +
                       fVar37 * auVar41._0_4_ + auVar43._0_4_ * fVar39 +
                       fVar20 * pfVar64[0x58] +
                       fVar18 * pfVar64[0x48] +
                       fVar10 * pfVar64[8] + fVar11 * pfVar64[0x10] + pfVar64[0x18] * fVar12 +
                       pfVar64[0x28] * fVar14 + fVar16 * pfVar64[0x38] + fVar22 * pfVar64[0x68] +
                       fVar24 * pfVar64[0x78] + fVar70 * pfVar64[0x88] + pfVar64[0x98] * fVar75 +
                       fVar32 * pfVar64[0xa8] + fVar34 * pfVar64[0xb8] + fVar79 * pfVar64[200] +
                       fVar36 * auVar66._0_4_ + fVar38 * auVar42._0_4_ + auVar44._0_4_ * fVar40;
                  auVar65._4_4_ =
                       fVar76 * pfVar64[0xc1] +
                       fVar21 * pfVar64[0x61] +
                       fVar9 * pfVar64[1] + *(float *)(pauVar55[1] + 4) + pfVar64[0x21] * fVar13 +
                       fVar15 * pfVar64[0x31] + fVar17 * pfVar64[0x41] + fVar19 * pfVar64[0x51] +
                       fVar23 * pfVar64[0x71] + fVar69 * pfVar64[0x81] + fVar71 * pfVar64[0x91] +
                       fVar31 * pfVar64[0xa1] + fVar33 * pfVar64[0xb1] + fVar35 * pfVar64[0xd1] +
                       fVar37 * auVar41._4_4_ + auVar43._4_4_ * fVar39 +
                       fVar20 * pfVar64[0x59] +
                       fVar18 * pfVar64[0x49] +
                       fVar10 * pfVar64[9] + fVar11 * pfVar64[0x11] + pfVar64[0x19] * fVar12 +
                       pfVar64[0x29] * fVar14 + fVar16 * pfVar64[0x39] + fVar22 * pfVar64[0x69] +
                       fVar24 * pfVar64[0x79] + fVar70 * pfVar64[0x89] + pfVar64[0x99] * fVar75 +
                       fVar32 * pfVar64[0xa9] + fVar34 * pfVar64[0xb9] + fVar79 * pfVar64[0xc9] +
                       fVar36 * auVar66._4_4_ + fVar38 * auVar42._4_4_ + auVar44._4_4_ * fVar40;
                  auVar65._8_4_ =
                       fVar76 * pfVar64[0xc2] +
                       fVar21 * pfVar64[0x62] +
                       fVar9 * pfVar64[2] + *(float *)(pauVar55[1] + 8) + pfVar64[0x22] * fVar13 +
                       fVar15 * pfVar64[0x32] + fVar17 * pfVar64[0x42] + fVar19 * pfVar64[0x52] +
                       fVar23 * pfVar64[0x72] + fVar69 * pfVar64[0x82] + fVar71 * pfVar64[0x92] +
                       fVar31 * pfVar64[0xa2] + fVar33 * pfVar64[0xb2] + fVar35 * pfVar64[0xd2] +
                       fVar37 * auVar41._8_4_ + auVar43._8_4_ * fVar39 +
                       fVar20 * pfVar64[0x5a] +
                       fVar18 * pfVar64[0x4a] +
                       fVar10 * pfVar64[10] + fVar11 * pfVar64[0x12] + pfVar64[0x1a] * fVar12 +
                       pfVar64[0x2a] * fVar14 + fVar16 * pfVar64[0x3a] + fVar22 * pfVar64[0x6a] +
                       fVar24 * pfVar64[0x7a] + fVar70 * pfVar64[0x8a] + pfVar64[0x9a] * fVar75 +
                       fVar32 * pfVar64[0xaa] + fVar34 * pfVar64[0xba] + fVar79 * pfVar64[0xca] +
                       fVar36 * auVar66._8_4_ + fVar38 * auVar42._8_4_ + auVar44._8_4_ * fVar40;
                  auVar65._12_4_ =
                       fVar76 * pfVar64[0xc3] +
                       fVar21 * pfVar64[99] +
                       fVar9 * pfVar64[3] + *(float *)(pauVar55[1] + 0xc) + pfVar64[0x23] * fVar13 +
                       fVar15 * pfVar64[0x33] + fVar17 * pfVar64[0x43] + fVar19 * pfVar64[0x53] +
                       fVar23 * pfVar64[0x73] + fVar69 * pfVar64[0x83] + fVar71 * pfVar64[0x93] +
                       fVar31 * pfVar64[0xa3] + fVar33 * pfVar64[0xb3] + fVar35 * pfVar64[0xd3] +
                       fVar37 * auVar41._12_4_ + auVar43._12_4_ * fVar39 +
                       fVar20 * pfVar64[0x5b] +
                       fVar18 * pfVar64[0x4b] +
                       fVar10 * pfVar64[0xb] + fVar11 * pfVar64[0x13] + pfVar64[0x1b] * fVar12 +
                       pfVar64[0x2b] * fVar14 + fVar16 * pfVar64[0x3b] + fVar22 * pfVar64[0x6b] +
                       fVar24 * pfVar64[0x7b] + fVar70 * pfVar64[0x8b] + pfVar64[0x9b] * fVar75 +
                       fVar32 * pfVar64[0xab] + fVar34 * pfVar64[0xbb] + fVar79 * pfVar64[0xcb] +
                       fVar36 * auVar66._12_4_ + fVar38 * auVar42._12_4_ + auVar44._12_4_ * fVar40;
                  auVar65._16_4_ =
                       fVar76 * pfVar64[0xc4] +
                       fVar21 * pfVar64[100] +
                       fVar9 * pfVar64[4] + *(float *)(pauVar55[1] + 0x10) + pfVar64[0x24] * fVar13
                       + fVar15 * pfVar64[0x34] + fVar17 * pfVar64[0x44] + fVar19 * pfVar64[0x54] +
                       fVar23 * pfVar64[0x74] + fVar69 * pfVar64[0x84] + fVar71 * pfVar64[0x94] +
                       fVar31 * pfVar64[0xa4] + fVar33 * pfVar64[0xb4] + fVar35 * pfVar64[0xd4] +
                       fVar37 * auVar41._16_4_ + auVar43._16_4_ * fVar39 +
                       fVar20 * pfVar64[0x5c] +
                       fVar18 * pfVar64[0x4c] +
                       fVar10 * pfVar64[0xc] + fVar11 * pfVar64[0x14] + pfVar64[0x1c] * fVar12 +
                       pfVar64[0x2c] * fVar14 + fVar16 * pfVar64[0x3c] + fVar22 * pfVar64[0x6c] +
                       fVar24 * pfVar64[0x7c] + fVar70 * pfVar64[0x8c] + pfVar64[0x9c] * fVar75 +
                       fVar32 * pfVar64[0xac] + fVar34 * pfVar64[0xbc] + fVar79 * pfVar64[0xcc] +
                       fVar36 * auVar66._16_4_ + fVar38 * auVar42._16_4_ + auVar44._16_4_ * fVar40;
                  auVar65._20_4_ =
                       fVar76 * pfVar64[0xc5] +
                       fVar21 * pfVar64[0x65] +
                       fVar9 * pfVar64[5] + *(float *)(pauVar55[1] + 0x14) + pfVar64[0x25] * fVar13
                       + fVar15 * pfVar64[0x35] + fVar17 * pfVar64[0x45] + fVar19 * pfVar64[0x55] +
                       fVar23 * pfVar64[0x75] + fVar69 * pfVar64[0x85] + fVar71 * pfVar64[0x95] +
                       fVar31 * pfVar64[0xa5] + fVar33 * pfVar64[0xb5] + fVar35 * pfVar64[0xd5] +
                       fVar37 * auVar41._20_4_ + auVar43._20_4_ * fVar39 +
                       fVar20 * pfVar64[0x5d] +
                       fVar18 * pfVar64[0x4d] +
                       fVar10 * pfVar64[0xd] + fVar11 * pfVar64[0x15] + pfVar64[0x1d] * fVar12 +
                       pfVar64[0x2d] * fVar14 + fVar16 * pfVar64[0x3d] + fVar22 * pfVar64[0x6d] +
                       fVar24 * pfVar64[0x7d] + fVar70 * pfVar64[0x8d] + pfVar64[0x9d] * fVar75 +
                       fVar32 * pfVar64[0xad] + fVar34 * pfVar64[0xbd] + fVar79 * pfVar64[0xcd] +
                       fVar36 * auVar66._20_4_ + fVar38 * auVar42._20_4_ + auVar44._20_4_ * fVar40;
                  auVar65._24_4_ =
                       fVar76 * pfVar64[0xc6] +
                       fVar21 * pfVar64[0x66] +
                       fVar9 * pfVar64[6] + *(float *)(pauVar55[1] + 0x18) + pfVar64[0x26] * fVar13
                       + fVar15 * pfVar64[0x36] + fVar17 * pfVar64[0x46] + fVar19 * pfVar64[0x56] +
                       fVar23 * pfVar64[0x76] + fVar69 * pfVar64[0x86] + fVar71 * pfVar64[0x96] +
                       fVar31 * pfVar64[0xa6] + fVar33 * pfVar64[0xb6] + fVar35 * pfVar64[0xd6] +
                       fVar37 * auVar41._24_4_ + auVar43._24_4_ * fVar39 +
                       fVar20 * pfVar64[0x5e] +
                       fVar18 * pfVar64[0x4e] +
                       fVar10 * pfVar64[0xe] + fVar11 * pfVar64[0x16] + pfVar64[0x1e] * fVar12 +
                       pfVar64[0x2e] * fVar14 + fVar16 * pfVar64[0x3e] + fVar22 * pfVar64[0x6e] +
                       fVar24 * pfVar64[0x7e] + fVar70 * pfVar64[0x8e] + pfVar64[0x9e] * fVar75 +
                       fVar32 * pfVar64[0xae] + fVar34 * pfVar64[0xbe] + fVar79 * pfVar64[0xce] +
                       fVar36 * auVar66._24_4_ + fVar38 * auVar42._24_4_ + auVar44._24_4_ * fVar40;
                  auVar65._28_4_ =
                       fVar76 + fVar21 + fVar67 + fVar50 + pfVar64[0x37] + fVar17 + pfVar64[0x57] +
                                fVar16 + pfVar64[0x87] + pfVar64[0x97] + fVar73 + fVar51 + fVar35 +
                       fVar35 + fVar35 +
                       fVar73 + pfVar64[0x97] + fVar51 + fVar51 + pfVar64[0xcf] + fVar35 + fVar35 +
                       fVar35;
                  *pauVar55 = auVar68;
                  pauVar55[1] = auVar65;
                  pfVar56 = pfVar56 + 0x10;
                  pfVar61 = pfVar61 + 0x10;
                  pauVar55 = pauVar55 + 2;
                  iVar59 = iVar59 + 2;
                  uVar58 = uVar47 & 0xfffffffe;
                } while (iVar59 < (int)uVar47);
              }
              iVar59 = uVar47 - uVar58;
              pfVar62 = pfVar61;
              if (iVar59 != 0 && (int)uVar58 <= (int)uVar47) {
                do {
                  fVar1 = *pfVar56;
                  fVar2 = pfVar56[1];
                  fVar3 = pfVar56[2];
                  fVar4 = pfVar56[3];
                  fVar5 = pfVar56[4];
                  fVar6 = pfVar56[5];
                  fVar7 = pfVar56[6];
                  fVar8 = pfVar56[7];
                  fVar69 = fVar2 + fVar3 + fVar3 + fVar4;
                  fVar9 = pfVar56[8];
                  fVar10 = pfVar56[9];
                  fVar11 = pfVar56[10];
                  fVar12 = pfVar56[0xb];
                  fVar13 = pfVar56[0xc];
                  fVar14 = pfVar56[0xd];
                  fVar15 = pfVar56[0xe];
                  fVar16 = pfVar56[0xf];
                  fVar70 = fVar3 + fVar69 + fVar9 + fVar10;
                  fVar71 = fVar9 + fVar70 + fVar9 + fVar10 + fVar9;
                  fVar17 = *pfVar62;
                  fVar18 = pfVar62[1];
                  fVar19 = pfVar62[2];
                  fVar20 = pfVar62[3];
                  fVar21 = pfVar62[4];
                  fVar22 = pfVar62[5];
                  fVar23 = pfVar62[6];
                  fVar24 = pfVar62[7];
                  pfVar56 = pfVar56 + 8;
                  pfVar61 = pfVar62 + 8;
                  fVar25 = pfVar62[8];
                  fVar26 = pfVar62[9];
                  fVar27 = pfVar62[10];
                  fVar28 = pfVar62[0xb];
                  fVar29 = pfVar62[0xc];
                  fVar30 = pfVar62[0xd];
                  fVar72 = pfVar62[0xe];
                  fVar74 = pfVar62[0xf];
                  fVar75 = fVar17 + fVar18 + fVar17 + fVar25 + fVar25 + fVar25 + fVar26;
                  auVar66._0_4_ =
                       fVar1 * *pfVar64 + *(float *)*pauVar55 +
                       fVar2 * pfVar64[8] + fVar3 * pfVar64[0x10] +
                       fVar4 * pfVar64[0x18] + fVar5 * pfVar64[0x20] + fVar6 * pfVar64[0x28] +
                       fVar7 * pfVar64[0x30] + fVar8 * pfVar64[0x38] + fVar9 * pfVar64[0x40] +
                       fVar10 * pfVar64[0x48] +
                       fVar11 * pfVar64[0x50] + fVar12 * pfVar64[0x58] + fVar13 * pfVar64[0x60] +
                       fVar14 * pfVar64[0x68] + fVar15 * pfVar64[0x70] +
                       fVar16 * pfVar64[0x78] + fVar17 * pfVar64[0x80] + fVar18 * pfVar64[0x88] +
                       fVar19 * pfVar64[0x90] + fVar20 * pfVar64[0x98] + fVar21 * pfVar64[0xa0] +
                       fVar22 * pfVar64[0xa8] + fVar23 * pfVar64[0xb0] + fVar24 * pfVar64[0xb8] +
                       fVar25 * pfVar64[0xc0] + fVar26 * pfVar64[200] + fVar27 * pfVar64[0xd0] +
                       fVar28 * pfVar64[0xd8] +
                       fVar29 * pfVar64[0xe0] + fVar30 * pfVar64[0xe8] + fVar72 * pfVar64[0xf0] +
                       fVar74 * pfVar64[0xf8];
                  auVar66._4_4_ =
                       fVar1 * pfVar64[1] + *(float *)((long)*pauVar55 + 4) +
                       fVar2 * pfVar64[9] + fVar3 * pfVar64[0x11] +
                       fVar4 * pfVar64[0x19] + fVar5 * pfVar64[0x21] + fVar6 * pfVar64[0x29] +
                       fVar7 * pfVar64[0x31] + fVar8 * pfVar64[0x39] + fVar9 * pfVar64[0x41] +
                       fVar10 * pfVar64[0x49] +
                       fVar11 * pfVar64[0x51] + fVar12 * pfVar64[0x59] + fVar13 * pfVar64[0x61] +
                       fVar14 * pfVar64[0x69] + fVar15 * pfVar64[0x71] +
                       fVar16 * pfVar64[0x79] + fVar17 * pfVar64[0x81] + fVar18 * pfVar64[0x89] +
                       fVar19 * pfVar64[0x91] + fVar20 * pfVar64[0x99] + fVar21 * pfVar64[0xa1] +
                       fVar22 * pfVar64[0xa9] + fVar23 * pfVar64[0xb1] + fVar24 * pfVar64[0xb9] +
                       fVar25 * pfVar64[0xc1] + fVar26 * pfVar64[0xc9] + fVar27 * pfVar64[0xd1] +
                       fVar28 * pfVar64[0xd9] +
                       fVar29 * pfVar64[0xe1] + fVar30 * pfVar64[0xe9] + fVar72 * pfVar64[0xf1] +
                       fVar74 * pfVar64[0xf9];
                  auVar66._8_4_ =
                       fVar1 * pfVar64[2] + *(float *)((long)*pauVar55 + 8) +
                       fVar2 * pfVar64[10] + fVar3 * pfVar64[0x12] +
                       fVar4 * pfVar64[0x1a] + fVar5 * pfVar64[0x22] + fVar6 * pfVar64[0x2a] +
                       fVar7 * pfVar64[0x32] + fVar8 * pfVar64[0x3a] + fVar9 * pfVar64[0x42] +
                       fVar10 * pfVar64[0x4a] +
                       fVar11 * pfVar64[0x52] + fVar12 * pfVar64[0x5a] + fVar13 * pfVar64[0x62] +
                       fVar14 * pfVar64[0x6a] + fVar15 * pfVar64[0x72] +
                       fVar16 * pfVar64[0x7a] + fVar17 * pfVar64[0x82] + fVar18 * pfVar64[0x8a] +
                       fVar19 * pfVar64[0x92] + fVar20 * pfVar64[0x9a] + fVar21 * pfVar64[0xa2] +
                       fVar22 * pfVar64[0xaa] + fVar23 * pfVar64[0xb2] + fVar24 * pfVar64[0xba] +
                       fVar25 * pfVar64[0xc2] + fVar26 * pfVar64[0xca] + fVar27 * pfVar64[0xd2] +
                       fVar28 * pfVar64[0xda] +
                       fVar29 * pfVar64[0xe2] + fVar30 * pfVar64[0xea] + fVar72 * pfVar64[0xf2] +
                       fVar74 * pfVar64[0xfa];
                  auVar66._12_4_ =
                       fVar1 * pfVar64[3] + *(float *)((long)*pauVar55 + 0xc) +
                       fVar2 * pfVar64[0xb] + fVar3 * pfVar64[0x13] +
                       fVar4 * pfVar64[0x1b] + fVar5 * pfVar64[0x23] + fVar6 * pfVar64[0x2b] +
                       fVar7 * pfVar64[0x33] + fVar8 * pfVar64[0x3b] + fVar9 * pfVar64[0x43] +
                       fVar10 * pfVar64[0x4b] +
                       fVar11 * pfVar64[0x53] + fVar12 * pfVar64[0x5b] + fVar13 * pfVar64[99] +
                       fVar14 * pfVar64[0x6b] + fVar15 * pfVar64[0x73] +
                       fVar16 * pfVar64[0x7b] + fVar17 * pfVar64[0x83] + fVar18 * pfVar64[0x8b] +
                       fVar19 * pfVar64[0x93] + fVar20 * pfVar64[0x9b] + fVar21 * pfVar64[0xa3] +
                       fVar22 * pfVar64[0xab] + fVar23 * pfVar64[0xb3] + fVar24 * pfVar64[0xbb] +
                       fVar25 * pfVar64[0xc3] + fVar26 * pfVar64[0xcb] + fVar27 * pfVar64[0xd3] +
                       fVar28 * pfVar64[0xdb] +
                       fVar29 * pfVar64[0xe3] + fVar30 * pfVar64[0xeb] + fVar72 * pfVar64[0xf3] +
                       fVar74 * pfVar64[0xfb];
                  auVar66._16_4_ =
                       fVar1 * pfVar64[4] + *(float *)((long)*pauVar55 + 0x10) +
                       fVar2 * pfVar64[0xc] + fVar3 * pfVar64[0x14] +
                       fVar4 * pfVar64[0x1c] + fVar5 * pfVar64[0x24] + fVar6 * pfVar64[0x2c] +
                       fVar7 * pfVar64[0x34] + fVar8 * pfVar64[0x3c] + fVar9 * pfVar64[0x44] +
                       fVar10 * pfVar64[0x4c] +
                       fVar11 * pfVar64[0x54] + fVar12 * pfVar64[0x5c] + fVar13 * pfVar64[100] +
                       fVar14 * pfVar64[0x6c] + fVar15 * pfVar64[0x74] +
                       fVar16 * pfVar64[0x7c] + fVar17 * pfVar64[0x84] + fVar18 * pfVar64[0x8c] +
                       fVar19 * pfVar64[0x94] + fVar20 * pfVar64[0x9c] + fVar21 * pfVar64[0xa4] +
                       fVar22 * pfVar64[0xac] + fVar23 * pfVar64[0xb4] + fVar24 * pfVar64[0xbc] +
                       fVar25 * pfVar64[0xc4] + fVar26 * pfVar64[0xcc] + fVar27 * pfVar64[0xd4] +
                       fVar28 * pfVar64[0xdc] +
                       fVar29 * pfVar64[0xe4] + fVar30 * pfVar64[0xec] + fVar72 * pfVar64[0xf4] +
                       fVar74 * pfVar64[0xfc];
                  auVar66._20_4_ =
                       fVar1 * pfVar64[5] + *(float *)((long)*pauVar55 + 0x14) +
                       fVar2 * pfVar64[0xd] + fVar3 * pfVar64[0x15] +
                       fVar4 * pfVar64[0x1d] + fVar5 * pfVar64[0x25] + fVar6 * pfVar64[0x2d] +
                       fVar7 * pfVar64[0x35] + fVar8 * pfVar64[0x3d] + fVar9 * pfVar64[0x45] +
                       fVar10 * pfVar64[0x4d] +
                       fVar11 * pfVar64[0x55] + fVar12 * pfVar64[0x5d] + fVar13 * pfVar64[0x65] +
                       fVar14 * pfVar64[0x6d] + fVar15 * pfVar64[0x75] +
                       fVar16 * pfVar64[0x7d] + fVar17 * pfVar64[0x85] + fVar18 * pfVar64[0x8d] +
                       fVar19 * pfVar64[0x95] + fVar20 * pfVar64[0x9d] + fVar21 * pfVar64[0xa5] +
                       fVar22 * pfVar64[0xad] + fVar23 * pfVar64[0xb5] + fVar24 * pfVar64[0xbd] +
                       fVar25 * pfVar64[0xc5] + fVar26 * pfVar64[0xcd] + fVar27 * pfVar64[0xd5] +
                       fVar28 * pfVar64[0xdd] +
                       fVar29 * pfVar64[0xe5] + fVar30 * pfVar64[0xed] + fVar72 * pfVar64[0xf5] +
                       fVar74 * pfVar64[0xfd];
                  auVar66._24_4_ =
                       fVar1 * pfVar64[6] + *(float *)((long)*pauVar55 + 0x18) +
                       fVar2 * pfVar64[0xe] + fVar3 * pfVar64[0x16] +
                       fVar4 * pfVar64[0x1e] + fVar5 * pfVar64[0x26] + fVar6 * pfVar64[0x2e] +
                       fVar7 * pfVar64[0x36] + fVar8 * pfVar64[0x3e] + fVar9 * pfVar64[0x46] +
                       fVar10 * pfVar64[0x4e] +
                       fVar11 * pfVar64[0x56] + fVar12 * pfVar64[0x5e] + fVar13 * pfVar64[0x66] +
                       fVar14 * pfVar64[0x6e] + fVar15 * pfVar64[0x76] +
                       fVar16 * pfVar64[0x7e] + fVar17 * pfVar64[0x86] + fVar18 * pfVar64[0x8e] +
                       fVar19 * pfVar64[0x96] + fVar20 * pfVar64[0x9e] + fVar21 * pfVar64[0xa6] +
                       fVar22 * pfVar64[0xae] + fVar23 * pfVar64[0xb6] + fVar24 * pfVar64[0xbe] +
                       fVar25 * pfVar64[0xc6] + fVar26 * pfVar64[0xce] + fVar27 * pfVar64[0xd6] +
                       fVar28 * pfVar64[0xde] +
                       fVar29 * pfVar64[0xe6] + fVar30 * pfVar64[0xee] + fVar72 * pfVar64[0xf6] +
                       fVar74 * pfVar64[0xfe];
                  auVar66._28_4_ =
                       fVar1 + *(float *)((long)*pauVar55 + 0x1c) + fVar2 + fVar3 + fVar69 + fVar70
                       + fVar71 + fVar71 + fVar17 + fVar17 + fVar18 + fVar17 + fVar17 + fVar75 +
                       fVar25 + fVar75 + fVar25 + fVar26;
                  *pauVar55 = auVar66;
                  pauVar55 = pauVar55 + 1;
                  iVar59 = iVar59 + -1;
                  pfVar62 = pfVar61;
                } while (iVar59 != 0);
              }
              pfVar56 = pfVar56 + 8;
              pfVar61 = pfVar61 + 8;
              iVar52 = iVar52 + 1;
            } while (iVar52 != iVar48);
          }
          uVar54 = uVar54 + 1;
        } while (uVar54 != uVar46);
      }
      lVar63 = lVar63 + 1;
    } while (lVar63 != iVar45);
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}